

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_lsrk_varjac.c
# Opt level: O1

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = *user_data;
  dVar2 = *(double *)((long)user_data + 8);
  pdVar4 = (double *)N_VGetArrayPointer();
  dVar3 = *pdVar4;
  dVar5 = ((10.0 - t) / 10.0) * 3.141592653589793;
  dVar6 = cos(dVar5);
  dVar5 = cos(dVar5);
  dVar7 = atan(t);
  pdVar4 = (double *)N_VGetArrayPointer(ydot);
  *pdVar4 = (1.0 / (t * t + 1.0) + (dVar1 - dVar6 * dVar2) * dVar3) -
            dVar7 * (dVar1 - dVar5 * dVar2);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter 1 */
  sunrealtype alpha  = rdata[1]; /* set shortcut for stiffness parameter 2 */
  sunrealtype u = N_VGetArrayPointer(y)[0]; /* access current solution value */

  /* fill in the RHS function: "N_VGetArrayPointer" accesses the 0th entry of ydot */
  N_VGetArrayPointer(ydot)[0] =
    (lambda - alpha * COS((SUN_RCONST(10.0) - t) / SUN_RCONST(10.0) *
                          ACOS(SUN_RCONST(-1.0)))) *
      u +
    SUN_RCONST(1.0) / (SUN_RCONST(1.0) + t * t) -
    (lambda - alpha * COS((SUN_RCONST(10.0) - t) / SUN_RCONST(10.0) *
                          ACOS(SUN_RCONST(-1.0)))) *
      ATAN(t);

  return 0; /* return with success */
}